

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::
SortSections<std::map<std::__cxx11::string,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>const*>>>,ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>>
          (DictionaryPrinter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>_>
          *sorted_section_dict,
          small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
          *section_dict)

{
  _Base_ptr p_Var1;
  bool bVar2;
  uint uVar3;
  mapped_type *ppvVar4;
  _Base_ptr p_Var5;
  TemplateString *ts;
  const_iterator it;
  TemplateString key;
  const_iterator local_90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>_>
  *local_80;
  UnsafeArena *local_78;
  TemplateDictionaryInterface local_70;
  UnsafeArena *local_68;
  string local_50;
  
  uVar3 = section_dict->size_;
  local_90.hash_iter_._M_node = (_Base_ptr)0x0;
  local_90.array_iter_ =
       (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
        *)&section_dict->field_2;
  if ((int)uVar3 < 0) {
    local_90.hash_iter_._M_node = *(_Base_ptr *)((long)&section_dict->field_2 + 0x20);
    local_90.array_iter_ =
         (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
          *)(_Base_ptr)0x0;
  }
  local_78 = (UnsafeArena *)((long)&section_dict->field_2 + 0x10);
  local_80 = sorted_section_dict;
  while( true ) {
    local_70._vptr_TemplateDictionaryInterface =
         (_func_int **)((section_dict->field_2).array_ + uVar3);
    if ((int)uVar3 < 0) {
      local_70._vptr_TemplateDictionaryInterface = (_func_int **)0x0;
      local_68 = local_78;
    }
    else {
      local_68 = (UnsafeArena *)0x0;
    }
    bVar2 = small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
            ::const_iterator::operator!=(&local_90,(const_iterator *)&local_70);
    if (!bVar2) {
      return;
    }
    p_Var5 = local_90.hash_iter_._M_node + 1;
    if ((_Base_ptr)local_90.array_iter_ != (_Base_ptr)0x0) {
      p_Var5 = (_Base_ptr)local_90.array_iter_;
    }
    TemplateString::IdToString((TemplateString *)&local_70,*(TemplateId *)p_Var5);
    if ((ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
         *)local_70._vptr_TemplateDictionaryInterface ==
        (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
         *)0x0) break;
    p_Var5 = local_90.hash_iter_._M_node + 1;
    if ((_Base_ptr)local_90.array_iter_ != (_Base_ptr)0x0) {
      p_Var5 = (_Base_ptr)local_90.array_iter_;
    }
    p_Var1 = p_Var5->_M_parent;
    PrintableTemplateString_abi_cxx11_(&local_50,(TemplateDictionary *)&local_70,ts);
    ppvVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>_>
              ::operator[](local_80,&local_50);
    *ppvVar4 = (mapped_type)p_Var1;
    std::__cxx11::string::~string((string *)&local_50);
    small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
    ::const_iterator::operator++(&local_90);
    uVar3 = section_dict->size_;
  }
  __assert_fail("!InvalidTemplateString(key)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                ,0x325,
                "void ctemplate::TemplateDictionary::DictionaryPrinter::SortSections(MyMap *, const MySectionDict &) [MyMap = std::map<std::basic_string<char>, const std::vector<ctemplate::TemplateDictionary *, ctemplate::ArenaAllocator<ctemplate::TemplateDictionary *, ctemplate::UnsafeArena>> *>, MySectionDict = ctemplate::small_map<std::map<unsigned long, std::vector<ctemplate::TemplateDictionary *, ctemplate::ArenaAllocator<ctemplate::TemplateDictionary *, ctemplate::UnsafeArena>> *, std::less<unsigned long>, ctemplate::ArenaAllocator<std::pair<const unsigned long, std::vector<ctemplate::TemplateDictionary *, ctemplate::ArenaAllocator<ctemplate::TemplateDictionary *, ctemplate::UnsafeArena>> *>, ctemplate::UnsafeArena>>, 4, std::equal_to<unsigned long>, ctemplate::TemplateDictionary::map_arena_init>]"
               );
}

Assistant:

void SortSections(MyMap* sorted_section_dict,
                    const MySectionDict& section_dict) {
    typename MySectionDict::const_iterator it = section_dict.begin();
    for (; it != section_dict.end(); ++it) {
      const TemplateString key = TemplateDictionary::IdToString(it->first);
      assert(!InvalidTemplateString(key));  // checks key.ptr_ != NULL
      (*sorted_section_dict)[PrintableTemplateString(key)] = it->second;
    }
  }